

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

NodeKey * Clasp::Cli::getNode(int16 id)

{
  undefined2 in_SI;
  NodeKey *in_RDI;
  
  switch(in_SI) {
  case 0:
    makeNode(in_RDI,"configuration",
             "Initializes this configuration\n      <arg>: {auto|frumpy|jumpy|tweety|handy|crafty|trendy|many|<file>}\n        auto  : Select configuration based on problem type\n        frumpy: Use conservative defaults\n        jumpy : Use aggressive defaults\n        tweety: Use defaults geared towards asp problems\n        handy : Use defaults geared towards large problems\n        crafty: Use defaults geared towards crafted problems\n        trendy: Use defaults geared towards industrial problems\n        many  : Use default portfolio to configure solver(s)\n        <file>: Use configuration file to configure solver(s)"
             ,0,0);
    break;
  case 1:
    makeNode(in_RDI,"share",
             "Configure physical sharing of constraints [%D]\n      %A: {auto|problem|learnt|all}",0
             ,0);
    break;
  case 2:
    makeNode(in_RDI,"learn_explicit","Do not use Short Implication Graph for learning",0,0);
    break;
  case 3:
    makeNode(in_RDI,"sat_prepro",
             "Run SatELite-like preprocessing (Implicit: %I)\n      %A: <level>[,<limit>...]\n        <level> : Set preprocessing level to <level  {1..3}>\n          1: Variable elimination with subsumption (VE)\n          2: VE with limited blocked clause elimination (BCE)\n          3: Full BCE followed by VE\n        <limit> : [<key {iter|occ|time|frozen|clause}>=]<n> (0=no limit)\n          iter  : Set iteration limit to <n>           [0]\n          occ   : Set variable occurrence limit to <n> [0]\n          time  : Set time limit to <n> seconds        [0]\n          frozen: Set frozen variables limit to <n>%%   [0]\n          size  : Set size limit to <n>*1000 clauses   [4000]"
             ,0,0);
    break;
  case 4:
    makeNode(in_RDI,"stats","Enable {1=basic|2=full} statistics (<t> for tester)",0,0);
    break;
  case 5:
    makeNode(in_RDI,"parse_ext","Enable extensions in non-aspif input",0,0);
    break;
  case 6:
    makeNode(in_RDI,"parse_maxsat","Treat dimacs input as MaxSAT problem",0,0);
    break;
  case 7:
    makeNode(in_RDI,"opt_strategy",
             "Configure optimization strategy\n      %A: {bb|usc}[,<tactics>]\n        bb : Model-guided optimization with <tactics {lin|hier|inc|dec}> [lin]\n          lin : Basic lexicographical descent\n          hier: Hierarchical (highest priority criteria first) descent \n          inc : Hierarchical descent with exponentially increasing steps\n          dec : Hierarchical descent with exponentially decreasing steps\n        usc: Core-guided optimization with <tactics>: <relax>[,<opts>]\n          <relax>: Relaxation algorithm {oll|one|k|pmres}                [oll]\n            oll    : Use strategy from unclasp\n            one    : Add one cardinality constraint per core\n            k[,<n>]: Add cardinality constraints of bounded size ([0]=dynamic)\n            pmres  : Add clauses of size 3\n          <opts> : Tactics <list {disjoint|succinct|stratify}>|<mask {0..7}>\n            disjoint: Disjoint-core preprocessing                    (1)\n            succinct: No redundant (symmetry) constraints            (2)\n            stratify: Stratification heuristic for handling weights  (4)"
             ,0,0);
    break;
  case 8:
    makeNode(in_RDI,"opt_usc_shrink",
             "Enable core-shrinking in core-guided optimization\n      %A: <algo>[,<limit> (0=no limit)]\n        <algo> : Use algorithm {lin|inv|bin|rgs|exp|min}\n          lin  : Forward linear search unsat\n          inv  : Inverse linear search not unsat\n          bin  : Binary search\n          rgs  : Repeated geometric sequence until unsat\n          exp  : Exponential search until unsat\n          min  : Linear search for subset minimal core\n        <limit>: Limit solve calls to 2^<n> conflicts [10]"
             ,0,0);
    break;
  case 9:
    makeNode(in_RDI,"opt_heuristic",
             "Enable optimization heuristic\n      %A: {sign|model}\n        sign : Prefer signs minimizing objective\n        model: Assume literals minimizing objective after each model"
             ,0,0);
    break;
  case 10:
    makeNode(in_RDI,"restart_on_model","Restart after each model\n",0,0);
    break;
  case 0xb:
    makeNode(in_RDI,"lookahead",
             "Configure failed-literal detection (fld)\n      %A: <type>[,<limit>] / Implicit: %I\n        <type> : Run fld via {atom|body|hybrid} lookahead\n        <limit>: Disable fld after <limit> applications ([0]=no limit)\n      --lookahead=atom is default if --no-lookback is used\n"
             ,0,0);
    break;
  case 0xc:
    makeNode(in_RDI,"heuristic",
             "Configure decision heuristic\n      %A: {Berkmin|Vmtf|Vsids|Domain|Unit|None}[,<n>]\n        Berkmin: Use BerkMin-like heuristic (Check last <n> nogoods [0]=all)\n        Vmtf   : Use Siege-like heuristic (Move <n> literals to the front [8])\n        Vsids  : Use Chaff-like heuristic (Use 1.0/0.<n> as decay factor  [95])\n        Domain : Use domain knowledge in Vsids-like heuristic\n        Unit   : Use Smodels-like heuristic (Default if --no-lookback)\n        None   : Select the first free variable"
             ,0,0);
    break;
  case 0xd:
    makeNode(in_RDI,"init_moms","Initialize heuristic with MOMS-score",0,0);
    break;
  case 0xe:
    makeNode(in_RDI,"score_res","Resolution score {auto|min|set|multiset}",0,0);
    break;
  case 0xf:
    makeNode(in_RDI,"score_other","Score other learnt nogoods: {auto|no|loop|all}",0,0);
    break;
  case 0x10:
    makeNode(in_RDI,"sign_def","Default sign: {asp|pos|neg|rnd}",0,0);
    break;
  case 0x11:
    makeNode(in_RDI,"sign_fix","Disable sign heuristics and use default signs only",0,0);
    break;
  case 0x12:
    makeNode(in_RDI,"berk_huang","Enable Huang-scoring in Berkmin",0,0);
    break;
  case 0x13:
    makeNode(in_RDI,"vsids_acids","Enable acids-scheme in Vsids/Domain",0,0);
    break;
  case 0x14:
    makeNode(in_RDI,"vsids_progress",
             "Enable dynamic decaying scheme in Vsids/Domain\n      %A: <n>[,<i {1..100}>][,<c>]|(0=disable)\n        <n> : Set initial decay factor to 1.0/0.<n>\n        <i> : Set decay update to <i>/100.0      [1]\n        <c> : Decrease decay every <c> conflicts [5000]"
             ,0,0);
    break;
  case 0x15:
    makeNode(in_RDI,"nant","Prefer negative antecedents of P in heuristic",0,0);
    break;
  case 0x16:
    makeNode(in_RDI,"dom_mod",
             "Default modification for domain heuristic\n      %A: (no|<mod>[,<pick>])\n        <mod>  : Modifier {level|pos|true|neg|false|init|factor}\n        <pick> : Apply <mod> to (all | <list {scc|hcc|disj|opt|show}>) atoms"
             ,0,0);
    break;
  case 0x17:
    makeNode(in_RDI,"save_progress","Use RSat-like progress saving on backjumps > %A",0,0);
    break;
  case 0x18:
    makeNode(in_RDI,"init_watches","Watched literal initialization: {rnd|first|least}",0,0);
    break;
  case 0x19:
    makeNode(in_RDI,"update_mode","Process messages on {propagate|conflict}",0,0);
    break;
  case 0x1a:
    makeNode(in_RDI,"acyc_prop","Use backward inference in acyc propagation",0,0);
    break;
  case 0x1b:
    makeNode(in_RDI,"seed","Set random number generator\'s seed to %A",0,0);
    break;
  case 0x1c:
    makeNode(in_RDI,"no_lookback","Disable all lookback strategies\n",0,0);
    break;
  case 0x1d:
    makeNode(in_RDI,"forget_on_step",
             "Configure forgetting on (incremental) step\n      %A: <list {varScores|signs|lemmaScores|lemmas}>|<mask {0..15}>\n"
             ,0,0);
    break;
  case 0x1e:
    makeNode(in_RDI,"strengthen",
             "Use MiniSAT-like conflict nogood strengthening\n      %A: <mode>[,<type>][,<bump {yes|no}>]\n        <mode>: Use {local|recursive} self-subsumption check\n        <type>: Follow {all|short|binary} antecedents [all]\n        <bump>: Bump activities of antecedents        [yes]"
             ,0,0);
    break;
  case 0x1f:
    makeNode(in_RDI,"otfs","Enable {1=partial|2=full} on-the-fly subsumption",0,0);
    break;
  case 0x20:
    makeNode(in_RDI,"update_lbd",
             "Configure LBD updates during conflict resolution\n      %A: <mode {less|glucose|pseudo}>[,<n {0..127}>]\n        less   : update to X = new LBD   iff X   < previous LBD\n        glucose: update to X = new LBD   iff X+1 < previous LBD\n        pseudo : update to X = new LBD+1 iff X   < previous LBD\n           <n> : Protect updated nogoods on next reduce if X <= <n>"
             ,0,0);
    break;
  case 0x21:
    makeNode(in_RDI,"update_act","Enable LBD-based activity bumping",0,0);
    break;
  case 0x22:
    makeNode(in_RDI,"reverse_arcs","Enable ManySAT-like inverse-arc learning",0,0);
    break;
  case 0x23:
    makeNode(in_RDI,"contraction",
             "Configure handling of long learnt nogoods\n      %A: <n>[,<rep>]\n        <n>  : Contract nogoods if size > <n> (0=disable)\n        <rep>: Nogood replacement {no|decisionSeq|allUIP|dynamic} [no]\n"
             ,0,0);
    break;
  case 0x24:
    makeNode(in_RDI,"loops",
             "Configure learning of loop nogoods\n      %A: {common|distinct|shared|no}\n        common  : Create loop nogoods for atoms in an unfounded set\n        distinct: Create distinct loop nogood for each atom in an unfounded set\n        shared  : Create loop formula for a whole unfounded set\n        no      : Do not learn loop formulas\n"
             ,0,0);
    break;
  case 0x25:
    makeNode(in_RDI,"partial_check",
             "Configure partial stability tests\n      %A: <p>[,<h>] / Implicit: %I\n        <p>: Partial check skip percentage\n        <h>: Init/update value for high bound ([0]=umax)"
             ,0,0);
    break;
  case 0x26:
    makeNode(in_RDI,"sign_def_disj","Default sign for atoms in disjunctions",0,0);
    break;
  case 0x27:
    makeNode(in_RDI,"rand_freq","Make random decisions with probability %A",0,0);
    break;
  case 0x28:
    makeNode(in_RDI,"rand_prob","Do <n> random searches with [<m>=100] conflicts",0,0);
    break;
  case 0x29:
    makeNode(in_RDI,"restarts",
             "Configure restart policy\n      %A: <type {F|L|x|+}>,<n {1..umax}>[,<args>][,<lim>]\n        F,<n>    : Run fixed sequence of <n> conflicts\n        L,<n>    : Run Luby et al.\'s sequence with unit length <n>\n        x,<n>,<f>: Run geometric seq. of <n>*(<f>^i) conflicts  (<f> >= 1.0)\n        +,<n>,<m>: Run arithmetic seq. of <n>+(<m>*i) conflicts (<m {0..umax}>)\n        ...,<lim>: Repeat sequence every <lim>+j restarts       (<type> != F)\n      %A: D,<n>,<K>[,<args>]: Dynamic restarts based on moving LBD average\n        <n>      : Fast moving average window size\n        <K>      : Fast margin (restart if fastAvg * <K> > slowAvg)\n        <L>      : LBD average limit                                [0 = none]\n        <f>      : Fast moving average type                         [d = SMA]\n          d      : Default\n          e|l    : EMA with alpha = 2/(<n>+1) or 1/log2(<n>)\n          es|ls  : e or l with exponentially decreasing alpha for first samples\n        <k>      : keep fast moving average on (r)estarts/(b)locks  [n = never]\n        <s>      : slow moving average type                         [d = CMA]\n        <w>      : slow moving average window size (<s> != d)       [200*<n>]\n      no|0       : Disable restarts"
             ,0,0);
    break;
  case 0x2a:
    makeNode(in_RDI,"reset_restarts","Update restart seq. on model {no|repeat|disable}",0,0);
    break;
  case 0x2b:
    makeNode(in_RDI,"local_restarts","Use Ryvchin et al.\'s local restarts",0,0);
    break;
  case 0x2c:
    makeNode(in_RDI,"counter_restarts",
             "Use counter implication restarts\n      %A: (<rate>[,<bump>] | {0|no})\n      <rate>: Interval in number of restarts\n      <bump>: Bump factor applied to indegrees"
             ,0,0);
    break;
  case 0x2d:
    makeNode(in_RDI,"block_restarts",
             "Use glucose-style blocking restarts\n      %A: <n>[,<R {1.0..5.0}>][,<c>][,<a>]\n        <n>: Window size for moving average (0=disable blocking)\n        <R>: Block restart if assignment > average * <R>  [1.4]\n        <c>: Disable blocking for the first <c> conflicts [10000]\n        <a>: Type of moving average (see restarts)        [e]\n"
             ,0,0);
    break;
  case 0x2e:
    makeNode(in_RDI,"shuffle","Shuffle problem after <n1>+(<n2>*i) restarts\n",0,0);
    break;
  case 0x2f:
    makeNode(in_RDI,"deletion",
             "Configure deletion algorithm [%D]\n      %A: <algo>[,<n {1..100}>][,<sc>]\n        <algo>: Use {basic|sort|ipSort|ipHeap} algorithm\n        <n>   : Delete at most <n>%% of nogoods on reduction    [75]\n        <sc>  : Use {activity|lbd|mixed} nogood scores    [activity]\n      no      : Disable nogood deletion"
             ,0,0);
    break;
  case 0x30:
    makeNode(in_RDI,"del_grow",
             "Configure size-based deletion policy\n      %A: <f>[,<g>][,<sched>] (<f> >= 1.0)\n        <f>     : Keep at most T = X*(<f>^i) learnt nogoods with X being the\n                  initial limit and i the number of times <sched> fired\n        <g>     : Stop growth once T > P*<g> (0=no limit)      [3.0]\n        <sched> : Set grow schedule (<type {F|L|x|+}>) [grow on restart]"
             ,0,0);
    break;
  case 0x31:
    makeNode(in_RDI,"del_cfl",
             "Configure conflict-based deletion policy\n      %A:   <type {F|L|x|+}>,<args>... (see restarts)"
             ,0,0);
    break;
  case 0x32:
    makeNode(in_RDI,"del_init",
             "Configure initial deletion limit\n      %A: <f>[,<n>,<o>] (<f> > 0)\n        <f>    : Set initial limit to P=estimated problem size/<f> [%D]\n        <n>,<o>: Clamp initial limit to the range [<n>,<n>+<o>]"
             ,0,0);
    break;
  case 0x33:
    makeNode(in_RDI,"del_estimate","Use estimated problem complexity in limits",0,0);
    break;
  case 0x34:
    makeNode(in_RDI,"del_max","Keep at most <n> learnt nogoods taking up to <X> MB",0,0);
    break;
  case 0x35:
    makeNode(in_RDI,"del_glue",
             "Configure glue clause handling\n      %A: <n {0..15}>[,<m {0|1}>]\n        <n>: Do not delete nogoods with LBD <= <n>\n        <m>: Count (0) or ignore (1) glue clauses in size limit [0]"
             ,0,0);
    break;
  case 0x36:
    makeNode(in_RDI,"del_on_restart","Delete %A%% of learnt nogoods on each restart",0,0);
    break;
  case 0x37:
    makeNode(in_RDI,"trans_ext",
             "Configure handling of extended rules\n      %A: {all|choice|card|weight|integ|dynamic}\n        all    : Transform all extended rules to basic rules\n        choice : Transform choice rules, but keep cardinality and weight rules\n        card   : Transform cardinality rules, but keep choice and weight rules\n        weight : Transform cardinality and weight rules, but keep choice rules\n        scc    : Transform \"recursive\" cardinality and weight rules\n        integ  : Transform cardinality integrity constraints\n        dynamic: Transform \"simple\" extended rules, but keep more complex ones"
             ,0,0);
    break;
  case 0x38:
    makeNode(in_RDI,"eq",
             "Configure equivalence preprocessing\n      Run for at most %A iterations (-1=run to fixpoint)"
             ,0,0);
    break;
  case 0x39:
    makeNode(in_RDI,"backprop","Use backpropagation in ASP-preprocessing",0,0);
    break;
  case 0x3a:
    makeNode(in_RDI,"supp_models","Compute supported models",0,0);
    break;
  case 0x3b:
    makeNode(in_RDI,"no_ufs_check","Disable unfounded set check",0,0);
    break;
  case 0x3c:
    makeNode(in_RDI,"no_gamma","Do not add gamma rules for non-hcf disjunctions",0,0);
    break;
  case 0x3d:
    makeNode(in_RDI,"eq_dfs","Enable df-order in eq-preprocessing",0,0);
    break;
  case 0x3e:
    makeNode(in_RDI,"dlp_old_map","Enable old mapping for disjunctive LPs",0,0);
    break;
  case 0x3f:
    makeNode(in_RDI,"solve_limit","Stop search after <n> conflicts or <m> restarts\n",0,0);
    break;
  case 0x40:
    makeNode(in_RDI,"parallel_mode",
             "Run parallel search with given number of threads\n      %A: <n {1..64}>[,<mode {compete|split}>]\n        <n>   : Number of threads to use in search\n        <mode>: Run competition or splitting based search [compete]\n"
             ,0,0);
    break;
  case 0x41:
    makeNode(in_RDI,"global_restarts",
             "Configure global restart policy\n      %A: <n>[,<sched>]\n        <n> : Maximal number of global restarts (0=disable)\n     <sched>: Restart schedule [x,100,1.5] (<type {F|L|x|+}>)\n"
             ,0,0);
    break;
  case 0x42:
    makeNode(in_RDI,"distribute",
             "Configure nogood distribution [%D]\n      %A: <type>[,<mode>][,<lbd {0..127}>][,<size>]\n        <type> : Distribute {all|short|conflict|loop} nogoods\n        <mode> : Use {global|local} distribution   [global]\n        <lbd>  : Distribute only if LBD  <= <lbd>  [4]\n        <size> : Distribute only if size <= <size> [-1]"
             ,0,0);
    break;
  case 0x43:
    makeNode(in_RDI,"integrate",
             "Configure nogood integration [%D]\n      %A: <pick>[,<n>][,<topo>]\n        <pick>: Add {all|unsat|gp(unsat wrt guiding path)|active} nogoods\n        <n>   : Always keep at least last <n> integrated nogoods   [1024]\n        <topo>: Accept nogoods from {all|ring|cube|cubex} peers    [all]\n"
             ,0,0);
    break;
  case 0x44:
    makeNode(in_RDI,"enum_mode",
             "Configure enumeration algorithm [%D]\n      %A: {bt|record|brave|cautious|auto}\n        bt      : Backtrack decision literals from solutions\n        record  : Add nogoods for computed solutions\n        domRec  : Add nogoods over true domain atoms\n        brave   : Compute brave consequences (union of models)\n        cautious: Compute cautious consequences (intersection of models)\n        auto    : Use bt for enumeration and record for optimization"
             ,0,0);
    break;
  case 0x45:
    makeNode(in_RDI,"project",
             "Enable projective solution enumeration\n      %A: {show|project|auto}[,<bt {0..3}>] (Implicit: %I)\n        Project to atoms in show or project directives, or\n        select depending on the existence of a project directive\n      <bt> : Additional options for enumeration algorithm \'bt\'\n        Use activity heuristic (1) when selecting backtracking literal\n        and/or progress saving (2) when retracting solution literals"
             ,0,0);
    break;
  case 0x46:
    makeNode(in_RDI,"models","Compute at most %A models (0 for all)\n",0,0);
    break;
  case 0x47:
    makeNode(in_RDI,"opt_mode",
             "Configure optimization algorithm\n      %A: <mode {opt|enum|optN|ignore}>[,<bound>...]\n        opt   : Find optimal model\n        enum  : Find models with costs <= <bound>\n        optN  : Find optimum, then enumerate optimal models\n        ignore: Ignore optimize statements\n      <bound> : Set initial bound for objective function(s)"
             ,0,0);
    break;
  case 0x48:
    makeNode(in_RDI,"opt_stop","Stop optimization on model with cost <= <bound> \n",0,0);
    break;
  case 0xfffffffb:
    makeNode(in_RDI,"","Options",-4,7);
    break;
  case 0xfffffffc:
    makeNode(in_RDI,"tester","Tester Options",-1,4);
    break;
  case 0xfffffffd:
    makeNode(in_RDI,"solve","Solve Options",0x3f,0x49);
    break;
  case 0xfffffffe:
    makeNode(in_RDI,"asp","Asp Options",0x37,0x3f);
    break;
  case 0xffffffff:
    makeNode(in_RDI,"solver","Solver Options",7,0x37);
    break;
  default:
    makeNode(in_RDI,"","",0,0);
  }
  return in_RDI;
}

Assistant:

static NodeKey getNode(int16 id) {
	assert(isValidId(id));
	switch(id) {
		case key_root  : return makeNode("", "Options", key_tester, option_category_global_end);
		case key_tester: return makeNode("tester", "Tester Options", key_solver, option_category_context_end);
		case key_solve : return makeNode("solve", "Solve Options", option_category_solve_begin, option_category_solve_end);
		case key_asp   : return makeNode("asp", "Asp Options", option_category_asp_begin, option_category_asp_end);
		case key_solver: return makeNode("solver", "Solver Options", option_category_solver_begin, option_category_search_end);
		case key_leaf  : return makeNode("configuration", KEY_INIT_DESC("Initializes this configuration\n"));
		#define OPTION(k, e, a, d, x, v) case opt_##k: return makeNode(#k, d);
		#define CLASP_ALL_GROUPS
		#include <clasp/cli/clasp_cli_options.inl>
		default        : return makeNode("", "");
	}
}